

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O0

void leveldb::EncodeFixed64(char *dst,uint64_t value)

{
  uint8_t *buffer;
  uint64_t value_local;
  char *dst_local;
  
  *dst = (char)value;
  dst[1] = (char)(value >> 8);
  dst[2] = (char)(value >> 0x10);
  dst[3] = (char)(value >> 0x18);
  dst[4] = (char)(value >> 0x20);
  dst[5] = (char)(value >> 0x28);
  dst[6] = (char)(value >> 0x30);
  dst[7] = (char)(value >> 0x38);
  return;
}

Assistant:

inline void EncodeFixed64(char* dst, uint64_t value) {
  uint8_t* const buffer = reinterpret_cast<uint8_t*>(dst);

  // Recent clang and gcc optimize this to a single mov / str instruction.
  buffer[0] = static_cast<uint8_t>(value);
  buffer[1] = static_cast<uint8_t>(value >> 8);
  buffer[2] = static_cast<uint8_t>(value >> 16);
  buffer[3] = static_cast<uint8_t>(value >> 24);
  buffer[4] = static_cast<uint8_t>(value >> 32);
  buffer[5] = static_cast<uint8_t>(value >> 40);
  buffer[6] = static_cast<uint8_t>(value >> 48);
  buffer[7] = static_cast<uint8_t>(value >> 56);
}